

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O1

void __thiscall Rectangle::Rectangle(Rectangle *this,Vector *l,Vector *s1,Vector *s2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_0010da60
  ;
  (this->loc).x = l->x;
  (this->loc).y = l->y;
  (this->loc).z = l->z;
  dVar2 = s1->x;
  (this->side1).x = dVar2;
  dVar5 = s1->y;
  (this->side1).y = dVar5;
  dVar6 = s1->z;
  (this->side1).z = dVar6;
  dVar3 = s2->x;
  (this->side2).x = dVar3;
  dVar4 = s2->y;
  (this->side2).y = dVar4;
  dVar1 = s2->z;
  (this->side2).z = dVar1;
  dVar7 = dVar5 * dVar1 - dVar4 * dVar6;
  dVar6 = dVar6 * dVar3 - dVar1 * dVar2;
  dVar5 = dVar2 * dVar4 - dVar3 * dVar5;
  dVar2 = dVar5 * dVar5 + dVar7 * dVar7 + dVar6 * dVar6;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (this->n).x = dVar7 / dVar2;
  (this->n).y = dVar6 / dVar2;
  (this->n).z = dVar5 / dVar2;
  dVar2 = (this->side1).x;
  dVar5 = (this->side1).y;
  dVar6 = (this->side1).z;
  dVar7 = dVar6 * dVar6 + dVar2 * dVar2 + dVar5 * dVar5;
  dVar3 = (this->side2).x;
  dVar4 = (this->side2).y;
  dVar1 = (this->side2).z;
  dVar8 = dVar6 * dVar1 + dVar2 * dVar3 + dVar5 * dVar4;
  dVar10 = dVar1 * dVar1 + dVar3 * dVar3 + dVar4 * dVar4;
  dVar9 = dVar7 * dVar10 - dVar10 * dVar8;
  dVar11 = (dVar2 * dVar10 - dVar3 * dVar8) / dVar9;
  dVar12 = (dVar5 * dVar10 - dVar4 * dVar8) / dVar9;
  dVar10 = (dVar10 * dVar6 - dVar1 * dVar8) / dVar9;
  (this->ku).x = dVar11;
  (this->ku).y = dVar12;
  (this->ku).z = dVar10;
  dVar3 = (dVar3 * dVar7 - dVar2 * dVar8) / dVar9;
  dVar4 = (dVar4 * dVar7 - dVar5 * dVar8) / dVar9;
  dVar9 = (dVar7 * dVar1 - dVar8 * dVar6) / dVar9;
  (this->kv).x = dVar3;
  (this->kv).y = dVar4;
  (this->kv).z = dVar9;
  dVar2 = (this->loc).x;
  dVar5 = (this->loc).y;
  dVar6 = (this->loc).z;
  this->u0 = -(dVar10 * dVar6 + dVar11 * dVar2 + dVar12 * dVar5);
  this->v0 = -(dVar9 * dVar6 + dVar3 * dVar2 + dVar4 * dVar5);
  return;
}

Assistant:

Rectangle::Rectangle( const Vector& l, const Vector& s1, const Vector& s2  )
{
   loc   = l;
   side1 =  s1;
   side2 =  s2;
   n =   normalize( side1 ^ side2 );

   double s11 = side1 & side1;
   double s12 = side1 & side2;
   double s22 = side2 & side2;
   double d = s11 * s22 - s12 * s22; // determinant

   ku = (side1 * s22 -  side2 *  s12) / d;
   kv = (side2 * s11 -  side1 *  s12) / d;
   u0 = -(loc & ku);
   v0 = -(loc & kv);
}